

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

const_iterator __thiscall
GainBuckets::moveCell(GainBuckets *this,int old_gain,const_iterator old_iter,int new_gain)

{
  bool bVar1;
  Bucket *__offin;
  Bucket *this_00;
  const_iterator cVar2;
  Bucket *pBVar3;
  __off64_t *in_R8;
  size_t in_R9;
  Bucket *new_bucket;
  Bucket *old_bucket;
  int new_gain_local;
  int old_gain_local;
  GainBuckets *this_local;
  const_iterator old_iter_local;
  
  __offin = operator[][abi_cxx11_(this,old_gain);
  this_00 = operator[][abi_cxx11_(this,new_gain);
  pBVar3 = this_00;
  cVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(this_00);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::splice
            (pBVar3,(int)cVar2._M_node,(__off64_t *)__offin,(int)old_iter._M_node,in_R8,in_R9,
             (uint)pBVar3);
  if (this->best_gain_ < new_gain) {
    this->best_gain_ = new_gain;
  }
  else if ((old_gain == this->best_gain_) && (new_gain < old_gain)) {
    while( true ) {
      pBVar3 = operator[][abi_cxx11_(this,this->best_gain_);
      bVar1 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(pBVar3);
      if (!bVar1) break;
      this->best_gain_ = this->best_gain_ + -1;
    }
  }
  cVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(this_00);
  return (const_iterator)cVar2._M_node;
}

Assistant:

GainBuckets::Bucket::const_iterator
GainBuckets::moveCell(int old_gain, Bucket::const_iterator old_iter, int new_gain) {
  auto &old_bucket = (*this)[old_gain], &new_bucket = (*this)[new_gain];
  new_bucket.splice(new_bucket.cbegin(), old_bucket, old_iter);
  if (new_gain > best_gain_)
    best_gain_ = new_gain;
  else if (old_gain == best_gain_ && new_gain < old_gain)
    while ((*this)[best_gain_].empty())
      --best_gain_;
  return new_bucket.cbegin();
}